

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void add_noise_to_block(aom_film_grain_t *params,uint8_t *luma,uint8_t *cb,uint8_t *cr,
                       int luma_stride,int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain
                       ,int luma_grain_stride,int chroma_grain_stride,int half_luma_height,
                       int half_luma_width,int bit_depth,int chroma_subsamp_y,int chroma_subsamp_x,
                       int mc_identity)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  bool bVar7;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int j_1;
  int i_1;
  int average_luma;
  int j;
  int i;
  int max_chroma;
  int min_chroma;
  int max_luma;
  int min_luma;
  int apply_cr;
  int apply_cb;
  int apply_y;
  int rounding_offset;
  int cr_offset;
  int cr_luma_mult;
  int cr_mult;
  int cb_offset;
  int cb_luma_mult;
  int cb_mult;
  int local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = *(int *)(in_RDI + 600) + -0x80;
  local_30 = *(int *)(in_RDI + 0x25c) + -0x80;
  local_34 = *(int *)(in_RDI + 0x260) + -0x100;
  local_38 = *(int *)(in_RDI + 0x264) + -0x80;
  local_3c = *(int *)(in_RDI + 0x268) + -0x80;
  local_40 = *(int *)(in_RDI + 0x26c) + -0x100;
  iVar3 = 1 << ((char)*(undefined4 *)(in_RDI + 0x124) - 1U & 0x1f);
  iVar5 = *(int *)(in_RDI + 0x78);
  bVar6 = true;
  if (*(int *)(in_RDI + 0xcc) < 1) {
    bVar6 = *(int *)(in_RDI + 0x27c) != 0;
  }
  bVar7 = true;
  if (*(int *)(in_RDI + 0x120) < 1) {
    bVar7 = *(int *)(in_RDI + 0x27c) != 0;
  }
  if (*(int *)(in_RDI + 0x27c) != 0) {
    local_2c = 0;
    local_30 = 0x40;
    local_34 = 0;
    local_38 = 0;
    local_3c = 0x40;
    local_40 = 0;
  }
  if (*(int *)(in_RDI + 0x274) == 0) {
    local_5c = 0;
    local_54 = 0;
    local_60 = 0xff;
    local_58 = 0xff;
  }
  else {
    local_54 = 0x10;
    local_58 = 0xeb;
    if (cr_offset == 0) {
      local_60 = 0xf0;
    }
    else {
      local_60 = 0xeb;
    }
    local_5c = 0x10;
  }
  for (local_64 = 0; bVar2 = (byte)apply_cr, local_64 < j << (1 - bVar2 & 0x1f);
      local_64 = local_64 + 1) {
    for (local_68 = 0; bVar1 = (byte)apply_y, local_68 < max_chroma << (1 - bVar1 & 0x1f);
        local_68 = local_68 + 1) {
      if (apply_y == 0) {
        local_6c = (uint)*(byte *)(in_RSI + ((local_64 << (bVar2 & 0x1f)) * in_R8D + local_68));
      }
      else {
        local_6c = (int)((uint)*(byte *)(in_RSI + ((local_64 << (bVar2 & 0x1f)) * in_R8D +
                                                  (local_68 << (bVar1 & 0x1f)))) +
                         (uint)*(byte *)(in_RSI + ((local_64 << (bVar2 & 0x1f)) * in_R8D +
                                                   (local_68 << (bVar1 & 0x1f)) + 1)) + 1) >> 1;
      }
      if (bVar6) {
        bVar1 = *(byte *)(in_RDX + (local_64 * in_R9D + local_68));
        iVar4 = clamp(((int)(local_6c * local_30 +
                            local_2c * (uint)*(byte *)(in_RDX + (local_64 * in_R9D + local_68))) >>
                      6) + local_34,0,(0x100 << ((char)max_luma - 8U & 0x1f)) + -1);
        iVar4 = scale_LUT(scaling_lut_cb,iVar4,8);
        iVar4 = clamp((uint)bVar1 +
                      (iVar4 * *(int *)(in_stack_00000010 + (long)(local_64 * i_1 + local_68) * 4) +
                       iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x124) & 0x1f)),local_5c,local_60);
        *(char *)(in_RDX + (local_64 * in_R9D + local_68)) = (char)iVar4;
      }
      if (bVar7) {
        bVar1 = *(byte *)(in_RCX + (local_64 * in_R9D + local_68));
        iVar4 = clamp(((int)(local_6c * local_3c +
                            local_38 * (uint)*(byte *)(in_RCX + (local_64 * in_R9D + local_68))) >>
                      6) + local_40,0,(0x100 << ((char)max_luma - 8U & 0x1f)) + -1);
        iVar4 = scale_LUT(scaling_lut_cr,iVar4,8);
        iVar4 = clamp((uint)bVar1 +
                      (iVar4 * *(int *)(in_stack_00000018 + (long)(local_64 * i_1 + local_68) * 4) +
                       iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x124) & 0x1f)),local_5c,local_60);
        *(char *)(in_RCX + (local_64 * in_R9D + local_68)) = (char)iVar4;
      }
    }
  }
  if (0 < iVar5) {
    for (local_70 = 0; SBORROW4(local_70,j * 2) != local_70 + j * -2 < 0; local_70 = local_70 + 1) {
      for (local_74 = 0; SBORROW4(local_74,max_chroma * 2) != local_74 + max_chroma * -2 < 0;
          local_74 = local_74 + 1) {
        bVar2 = *(byte *)(in_RSI + (local_70 * in_R8D + local_74));
        iVar5 = scale_LUT(scaling_lut_y,(uint)*(byte *)(in_RSI + (local_70 * in_R8D + local_74)),8);
        iVar5 = clamp((uint)bVar2 +
                      (iVar5 * *(int *)(in_stack_00000008 +
                                       (long)(local_70 * in_stack_00000020 + local_74) * 4) + iVar3
                      >> ((byte)*(undefined4 *)(in_RDI + 0x124) & 0x1f)),local_54,local_58);
        *(char *)(in_RSI + (local_70 * in_R8D + local_74)) = (char)iVar5;
      }
    }
  }
  return;
}

Assistant:

static void add_noise_to_block(const aom_film_grain_t *params, uint8_t *luma,
                               uint8_t *cb, uint8_t *cr, int luma_stride,
                               int chroma_stride, int *luma_grain,
                               int *cb_grain, int *cr_grain,
                               int luma_grain_stride, int chroma_grain_stride,
                               int half_luma_height, int half_luma_width,
                               int bit_depth, int chroma_subsamp_y,
                               int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  int cb_offset = params->cb_offset - 256;

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  int cr_offset = params->cr_offset - 256;

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range;
    max_luma = max_luma_legal_range;

    if (mc_identity) {
      min_chroma = min_luma_legal_range;
      max_chroma = max_luma_legal_range;
    } else {
      min_chroma = min_chroma_legal_range;
      max_chroma = max_chroma_legal_range;
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = 255;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }

      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j], 8) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}